

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O3

void save_room(memfile *mf,mkroom *r)

{
  long lVar1;
  
  mwrite8(mf,r->lx);
  mwrite8(mf,r->hx);
  mwrite8(mf,r->ly);
  mwrite8(mf,r->hy);
  mwrite8(mf,r->rtype);
  mwrite8(mf,r->rlit);
  mwrite8(mf,r->doorct);
  mwrite8(mf,r->fdoor);
  mwrite8(mf,r->nsubrooms);
  mwrite8(mf,r->irregular);
  if ('\0' < r->nsubrooms) {
    lVar1 = 0;
    do {
      save_room(mf,r->sbrooms[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < r->nsubrooms);
  }
  return;
}

Assistant:

static void save_room(struct memfile *mf, struct mkroom *r)
{
	short i;

	/*
	 * No tag; we tag room-saving once per level, because the
	 * rooms don't change in number once the level is created.
	 */
	mwrite8(mf, r->lx);
	mwrite8(mf, r->hx);
	mwrite8(mf, r->ly);
	mwrite8(mf, r->hy);
	mwrite8(mf, r->rtype);
	mwrite8(mf, r->rlit);
	mwrite8(mf, r->doorct);
	mwrite8(mf, r->fdoor);
	mwrite8(mf, r->nsubrooms);
	mwrite8(mf, r->irregular);

	for (i = 0; i < r->nsubrooms; i++)
	    save_room(mf, r->sbrooms[i]);
}